

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool TestHashList<Blob<224>>
               (vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  __normal_iterator<Blob<224>_*,_std::vector<Blob<224>,_std::allocator<Blob<224>_>_>_> __first;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Blob<224> *pBVar9;
  reference pvVar10;
  uint in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  undefined4 uVar11;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_RDI;
  byte in_R8B;
  byte in_R9B;
  double dVar12;
  double dVar13;
  size_t i;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> revhashes;
  HashSet<Blob<224>_> collisions;
  double collcount;
  double expected;
  size_t count;
  bool result;
  undefined2 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeea;
  undefined1 in_stack_fffffffffffffeeb;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  __normal_iterator<Blob<224>_*,_std::vector<Blob<224>,_std::allocator<Blob<224>_>_>_> __last;
  int in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff09;
  undefined1 in_stack_ffffffffffffff0a;
  undefined1 in_stack_ffffffffffffff0b;
  uint uVar14;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffff30;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffff48;
  Blob<224> local_a4;
  uint8_t *local_88;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_80;
  undefined1 in_stack_ffffffffffffffa7;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffffa8;
  bool local_e;
  
  uVar1 = in_ECX & 1;
  local_e = true;
  if ((in_EDX & 1) != 0) {
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(in_RDI);
    uVar14 = 0xe0;
    dVar12 = EstimateNbCollisions
                       (CONCAT13(in_stack_ffffffffffffff07,
                                 CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
                        in_stack_ffffffffffffff00);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",dVar12,(ulong)uVar14);
    HashSet<Blob<224>_>::HashSet((HashSet<Blob<224>_> *)0x190063);
    uVar11 = (undefined4)((ulong)&stack0xffffffffffffffa8 >> 0x20);
    iVar8 = FindCollisions<Blob<224>>
                      (in_stack_ffffffffffffff30,(HashSet<Blob<224>_> *)CONCAT44(in_ESI,in_EDX),
                       in_ECX);
    dVar13 = (double)iVar8;
    printf("actual %6i (%.2fx)",dVar13 / dVar12,CONCAT44(uVar11,(int)dVar13));
    if (0.0 < dVar13) {
      printf(" !!!!!");
    }
    local_e = 0.0 >= dVar13;
    printf("\n");
    fflush((FILE *)0x0);
    if ((in_R8B & 1) != 0) {
      in_stack_ffffffffffffff0b =
           CountHighbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      local_e = (bool)in_stack_ffffffffffffff0b && local_e;
      in_stack_ffffffffffffff0a =
           CountHighbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      local_e = (bool)in_stack_ffffffffffffff0a && local_e;
      in_stack_ffffffffffffff09 =
           CountHighbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      local_e = (bool)in_stack_ffffffffffffff09 && local_e;
      in_stack_ffffffffffffff08 =
           CountHighbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      local_e = (bool)in_stack_ffffffffffffff08 && local_e;
      in_stack_ffffffffffffff07 =
           CountHighbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      local_e = (bool)in_stack_ffffffffffffff07 && local_e;
      in_stack_ffffffffffffff06 =
           TestHighbitsCollisions<Blob<224>>
                     ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)CONCAT44(in_ESI,in_EDX));
      local_e = local_e && (bool)in_stack_ffffffffffffff06;
    }
    if ((in_R9B & 1) != 0) {
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
                ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      local_88 = (uint8_t *)0x0;
      while( true ) {
        __last._M_current = (Blob<224> *)local_88;
        pBVar9 = (Blob<224> *)std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(&local_80);
        if (pBVar9 <= __last._M_current) break;
        pvVar10 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[]
                            (in_RDI,(size_type)local_88);
        Blob<224>::Blob((Blob<224> *)&stack0xffffffffffffff40,pvVar10);
        bitreverse<Blob<224>>
                  ((Blob<224> *)
                   CONCAT44(uVar14,CONCAT13(in_stack_ffffffffffffff0b,
                                            CONCAT12(in_stack_ffffffffffffff0a,
                                                     CONCAT11(in_stack_ffffffffffffff09,
                                                              in_stack_ffffffffffffff08)))),
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,
                                     CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)))
                  );
        pvVar10 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[]
                            (&local_80,(size_type)local_88);
        Blob<224>::operator=(pvVar10,&local_a4);
        local_88 = local_88 + 1;
      }
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::begin
                ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
                 CONCAT17(in_stack_fffffffffffffeef,
                          CONCAT16(in_stack_fffffffffffffeee,
                                   CONCAT15(in_stack_fffffffffffffeed,
                                            CONCAT14(in_stack_fffffffffffffeec,
                                                     CONCAT13(in_stack_fffffffffffffeeb,
                                                              CONCAT12(in_stack_fffffffffffffeea,
                                                                       in_stack_fffffffffffffee8))))
                                  )));
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::end
                ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
                 CONCAT17(in_stack_fffffffffffffeef,
                          CONCAT16(in_stack_fffffffffffffeee,
                                   CONCAT15(in_stack_fffffffffffffeed,
                                            CONCAT14(in_stack_fffffffffffffeec,
                                                     CONCAT13(in_stack_fffffffffffffeeb,
                                                              CONCAT12(in_stack_fffffffffffffeea,
                                                                       in_stack_fffffffffffffee8))))
                                  )));
      __first._M_current._4_2_ = in_stack_ffffffffffffff04;
      __first._M_current._0_4_ = in_stack_ffffffffffffff00;
      __first._M_current._6_1_ = in_stack_ffffffffffffff06;
      __first._M_current._7_1_ = in_stack_ffffffffffffff07;
      std::
      sort<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>>
                (__first,__last);
      bVar2 = CountLowbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44)
      ;
      bVar3 = CountLowbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44)
      ;
      bVar4 = CountLowbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44)
      ;
      bVar5 = CountLowbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44)
      ;
      bVar6 = CountLowbitsCollisions<Blob<224>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44)
      ;
      bVar7 = TestLowbitsCollisions<Blob<224>>
                        ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)CONCAT44(in_ESI,in_EDX));
      local_e = (bVar6 & bVar5 & bVar4 & bVar3 & bVar2 & local_e & bVar7) != 0;
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector
                ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff07,
                          CONCAT16(in_stack_ffffffffffffff06,
                                   CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))));
    }
    HashSet<Blob<224>_>::~HashSet((HashSet<Blob<224>_> *)0x1904dc);
  }
  if (uVar1 != 0) {
    bVar2 = TestDistribution<Blob<224>>(in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7);
    local_e = (local_e & bVar2) != 0;
  }
  return local_e;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if (testCollision)
  {
    size_t const count = hashes.size();
    double const expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if ((collcount / expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");
    fflush(NULL);

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 224);
      result &= CountHighbitsCollisions(hashes, 160);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);

      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountHighbitsCollisions(hashes,   12);
      //result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(hashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 224);
      result &= CountLowbitsCollisions(revhashes, 160);
      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountLowbitsCollisions(revhashes,   12);
      //result &= CountLowbitsCollisions(revhashes,   8);

      //std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}